

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffbnfmll(char *tform,int *dtcode,LONGLONG *trepeat,long *twidth,int *status)

{
  size_t sVar1;
  ushort **ppuVar2;
  double local_120;
  double drepeat;
  char message [81];
  char local_b8 [8];
  char temp [71];
  char *form;
  LONGLONG repeat;
  long width;
  int local_50;
  int iread;
  int variable;
  int datacode;
  size_t nchar;
  size_t ii;
  int *status_local;
  long *twidth_local;
  LONGLONG *trepeat_local;
  int *dtcode_local;
  char *tform_local;
  
  if (*status < 1) {
    if (dtcode != (int *)0x0) {
      *dtcode = 0;
    }
    if (trepeat != (LONGLONG *)0x0) {
      *trepeat = 0;
    }
    if (twidth != (long *)0x0) {
      *twidth = 0;
    }
    ii = (size_t)status;
    status_local = (int *)twidth;
    twidth_local = trepeat;
    trepeat_local = (LONGLONG *)dtcode;
    dtcode_local = (int *)tform;
    _variable = strlen(tform);
    for (nchar = 0; (nchar < _variable && (*(char *)((long)dtcode_local + nchar) == ' '));
        nchar = nchar + 1) {
    }
    if (nchar == _variable) {
      ffpmsg("Error: binary table TFORM code is blank (ffbnfmll).");
      *(undefined4 *)ii = 0x105;
      tform_local._4_4_ = 0x105;
    }
    else {
      sVar1 = strlen((char *)((long)dtcode_local + nchar));
      if (sVar1 < 0x47) {
        strcpy(local_b8,(char *)((long)dtcode_local + nchar));
        ffupch(local_b8);
        unique0x00004880 = local_b8;
        nchar = 0;
        while (ppuVar2 = __ctype_b_loc(),
              ((*ppuVar2)[(int)stack0xffffffffffffff90[nchar]] & 0x800) != 0) {
          nchar = nchar + 1;
        }
        if (nchar == 0) {
          form = (char *)0x1;
        }
        else {
          __isoc99_sscanf(stack0xffffffffffffff90,"%lf",&local_120);
          form = (char *)(long)(local_120 + 0.1);
        }
        register0x00000000 = stack0xffffffffffffff90 + nchar;
        if ((*register0x00000000 == 'P') || (*register0x00000000 == 'Q')) {
          local_50 = 1;
          register0x00000000 = register0x00000000 + 1;
        }
        else {
          local_50 = 0;
        }
        if (*stack0xffffffffffffff90 == 'U') {
          iread = 0x14;
          repeat = 2;
        }
        else if (*stack0xffffffffffffff90 == 'I') {
          iread = 0x15;
          repeat = 2;
        }
        else if (*stack0xffffffffffffff90 == 'V') {
          iread = 0x28;
          repeat = 4;
        }
        else if (*stack0xffffffffffffff90 == 'W') {
          iread = 0x50;
          repeat = 8;
        }
        else if (*stack0xffffffffffffff90 == 'J') {
          iread = 0x29;
          repeat = 4;
        }
        else if (*stack0xffffffffffffff90 == 'K') {
          iread = 0x51;
          repeat = 8;
        }
        else if (*stack0xffffffffffffff90 == 'E') {
          iread = 0x2a;
          repeat = 4;
        }
        else if (*stack0xffffffffffffff90 == 'D') {
          iread = 0x52;
          repeat = 8;
        }
        else if (*stack0xffffffffffffff90 == 'A') {
          iread = 0x10;
          width._4_4_ = 0;
          if (stack0xffffffffffffff90[1] != '\0') {
            if (stack0xffffffffffffff90[1] == '(') {
              register0x00000000 = stack0xffffffffffffff90 + 1;
            }
            width._4_4_ = __isoc99_sscanf(stack0xffffffffffffff90 + 1,"%ld",&repeat);
          }
          if ((width._4_4_ != 1) || ((local_50 == 0 && ((long)form < repeat)))) {
            repeat = (LONGLONG)form;
          }
        }
        else if (*stack0xffffffffffffff90 == 'L') {
          iread = 0xe;
          repeat = 1;
        }
        else if (*stack0xffffffffffffff90 == 'X') {
          iread = 1;
          repeat = 1;
        }
        else if (*stack0xffffffffffffff90 == 'B') {
          iread = 0xb;
          repeat = 1;
        }
        else if (*stack0xffffffffffffff90 == 'S') {
          iread = 0xc;
          repeat = 1;
        }
        else if (*stack0xffffffffffffff90 == 'C') {
          iread = 0x53;
          repeat = 8;
        }
        else {
          if (*stack0xffffffffffffff90 != 'M') {
            snprintf((char *)&drepeat,0x51,"Illegal binary table TFORMn datatype: \'%s\' ",
                     dtcode_local);
            ffpmsg((char *)&drepeat);
            *(undefined4 *)ii = 0x106;
            return 0x106;
          }
          iread = 0xa3;
          repeat = 0x10;
        }
        if (local_50 != 0) {
          iread = -iread;
        }
        if (trepeat_local != (LONGLONG *)0x0) {
          *(int *)trepeat_local = iread;
        }
        if (twidth_local != (long *)0x0) {
          *twidth_local = (long)form;
        }
        if (status_local != (int *)0x0) {
          *(LONGLONG *)status_local = repeat;
        }
        tform_local._4_4_ = *(int *)ii;
      }
      else {
        ffpmsg("Error: binary table TFORM code is too long (ffbnfmll).");
        *(undefined4 *)ii = 0x105;
        tform_local._4_4_ = 0x105;
      }
    }
  }
  else {
    tform_local._4_4_ = *status;
  }
  return tform_local._4_4_;
}

Assistant:

int ffbnfmll(char *tform,     /* I - format code from the TFORMn keyword */
           int *dtcode,   /* O - numerical datatype code */
           LONGLONG *trepeat,    /* O - repeat count of the field  */
           long *twidth,     /* O - width of the field, in chars */
           int *status)     /* IO - error status      */
{
/*
  parse the binary table TFORM column format to determine the data
  type, repeat count, and the field width (if it is an ASCII (A) field)
*/
    size_t ii, nchar;
    int datacode, variable, iread;
    long width;
    LONGLONG repeat;
    char *form, temp[FLEN_VALUE], message[FLEN_ERRMSG];
    double drepeat;

    if (*status > 0)
        return(*status);

    if (dtcode)
        *dtcode = 0;

    if (trepeat)
        *trepeat = 0;

    if (twidth)
        *twidth = 0;

    nchar = strlen(tform);

    for (ii = 0; ii < nchar; ii++)
    {
        if (tform[ii] != ' ')     /* find first non-space char */
            break;
    }

    if (ii == nchar)
    {
        ffpmsg("Error: binary table TFORM code is blank (ffbnfmll).");
        return(*status = BAD_TFORM);
    }
    
    if (strlen(&tform[ii]) > FLEN_VALUE-1)
    {
       ffpmsg("Error: binary table TFORM code is too long (ffbnfmll).");
       return(*status = BAD_TFORM);
    }
    strcpy(temp, &tform[ii]); /* copy format string */
    ffupch(temp);     /* make sure it is in upper case */
    form = temp;      /* point to start of format string */

    /*-----------------------------------------------*/
    /*       get the repeat count                    */
    /*-----------------------------------------------*/

    ii = 0;
    while(isdigit((int) form[ii]))
        ii++;   /* look for leading digits in the field */

    if (ii == 0)
        repeat = 1;  /* no explicit repeat count */
    else {
       /* read repeat count */

        /* print as double, because the string-to-64-bit int conversion */
        /* character is platform dependent (%lld, %ld, %I64d)           */

        sscanf(form,"%lf", &drepeat);
        repeat = (LONGLONG) (drepeat + 0.1);
    }
    /*-----------------------------------------------*/
    /*             determine datatype code           */
    /*-----------------------------------------------*/

    form = form + ii;  /* skip over the repeat field */

    if (form[0] == 'P' || form[0] == 'Q')
    {
        variable = 1;  /* this is a variable length column */
/*        repeat = 1;  */  /* disregard any other repeat value */
        form++;        /* move to the next data type code char */
    }
    else
        variable = 0;

    if (form[0] == 'U')  /* internal code to signify unsigned integer */
    { 
        datacode = TUSHORT;
        width = 2;
    }
    else if (form[0] == 'I')
    {
        datacode = TSHORT;
        width = 2;
    }
    else if (form[0] == 'V') /* internal code to signify unsigned integer */
    {
        datacode = TULONG;
        width = 4;
    }
    else if (form[0] == 'W') /* internal code to signify unsigned long long integer */
    {
        datacode = TULONGLONG;
        width = 8;
    }
    else if (form[0] == 'J')
    {
        datacode = TLONG;
        width = 4;
    }
    else if (form[0] == 'K')
    {
        datacode = TLONGLONG;
        width = 8;
    }
    else if (form[0] == 'E')
    {
        datacode = TFLOAT;
        width = 4;
    }
    else if (form[0] == 'D')
    {
        datacode = TDOUBLE;
        width = 8;
    }
    else if (form[0] == 'A')
    {
        datacode = TSTRING;

        /*
          the following code is used to support the non-standard
          datatype of the form rAw where r = total width of the field
          and w = width of fixed-length substrings within the field.
        */
        iread = 0;
        if (form[1] != 0)
        {
            if (form[1] == '(' )  /* skip parenthesis around */
                form++;          /* variable length column width */

            iread = sscanf(&form[1],"%ld", &width);
        }

        if (iread != 1 || (!variable && (width > repeat)) )
            width = (long) repeat;
  
    }
    else if (form[0] == 'L')
    {
        datacode = TLOGICAL;
        width = 1;
    }
    else if (form[0] == 'X')
    {
        datacode = TBIT;
        width = 1;
    }
    else if (form[0] == 'B')
    {
        datacode = TBYTE;
        width = 1;
    }
    else if (form[0] == 'S') /* internal code to signify signed byte */
    {
        datacode = TSBYTE;
        width = 1;
    }
    else if (form[0] == 'C')
    {
        datacode = TCOMPLEX;
        width = 8;
    }
    else if (form[0] == 'M')
    {
        datacode = TDBLCOMPLEX;
        width = 16;
    }
    else
    {
        snprintf(message, FLEN_ERRMSG,
        "Illegal binary table TFORMn datatype: \'%s\' ", tform);
        ffpmsg(message);
        return(*status = BAD_TFORM_DTYPE);
    }

    if (variable)
        datacode = datacode * (-1); /* flag variable cols w/ neg type code */

    if (dtcode)
       *dtcode = datacode;

    if (trepeat)
       *trepeat = repeat;

    if (twidth)
       *twidth = width;

    return(*status);
}